

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

MessageProcessingResult __thiscall
helics::FederateState::genericUnspecifiedQueueProcess(FederateState *this,bool busyReturn)

{
  byte bVar1;
  bool bVar2;
  MessageProcessingResult MVar3;
  FederateStates FVar4;
  pointer this_00;
  Time TVar5;
  byte in_SIL;
  FederateState *in_RDI;
  FederateState *in_stack_00000010;
  MessageProcessingResult ret;
  MessageProcessingResult ret_1;
  FederateState *in_stack_00000168;
  TimeCoordinator *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  memory_order in_stack_ffffffffffffffc4;
  MessageProcessingResult local_29;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 busyReturn_00;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  MessageProcessingResult local_1;
  
  busyReturn_00 = (undefined1)((ulong)in_stack_ffffffffffffffe0 >> 0x38);
  bVar1 = in_SIL & 1;
  bVar2 = try_lock(in_RDI);
  if (bVar2) {
    local_1 = processQueue(in_stack_00000168);
    if (local_1 != USER_RETURN) {
      this_00 = std::
                unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
                operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                            *)0x4e960d);
      TVar5 = TimeCoordinator::getGrantedTime(this_00);
      (in_RDI->time_granted).internalTimeCode = TVar5.internalTimeCode;
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x4e9634);
      TVar5 = TimeCoordinator::allowedSendTime(in_stack_ffffffffffffffb8);
      (in_RDI->allowed_send_time).internalTimeCode = TVar5.internalTimeCode;
    }
    unlock((FederateState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else {
    bVar2 = std::atomic<bool>::load((atomic<bool> *)in_RDI,in_stack_ffffffffffffffc4);
    if (!bVar2) {
      std::this_thread::yield();
      bVar2 = std::atomic<bool>::load((atomic<bool> *)in_RDI,in_stack_ffffffffffffffc4);
      if (!bVar2) {
        MVar3 = genericUnspecifiedQueueProcess
                          ((FederateState *)
                           CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffee,
                                                   in_stack_ffffffffffffffe8)),(bool)busyReturn_00);
        return MVar3;
      }
    }
    if ((bVar1 & 1) == 0) {
      sleeplock(in_stack_00000010);
      FVar4 = getState((FederateState *)0x4e96e2);
      if (FVar4 == ERRORED) {
        local_29 = ERROR_RESULT;
      }
      else if (FVar4 == FINISHED) {
        local_29 = HALTED;
      }
      else {
        local_29 = NEXT_STEP;
      }
      unlock((FederateState *)
             CONCAT44(CONCAT13(FVar4,(int3)in_stack_ffffffffffffffc4),in_stack_ffffffffffffffc0));
      local_1 = local_29;
    }
    else {
      local_1 = BUSY;
    }
  }
  return local_1;
}

Assistant:

MessageProcessingResult FederateState::genericUnspecifiedQueueProcess(bool busyReturn)
{
    if (try_lock()) {  // only 1 thread can enter this loop once per federate
        auto ret = processQueue();
        if (ret != MessageProcessingResult::USER_RETURN) {
            time_granted = timeCoord->getGrantedTime();
            allowed_send_time = timeCoord->allowedSendTime();
        }
        unlock();
        return ret;
    }
    // if this is not true then try again the core may have been handling something short so try
    // again
    if (!queueProcessing.load()) {
        std::this_thread::yield();
        if (!queueProcessing.load()) {
            return genericUnspecifiedQueueProcess(busyReturn);
        }
    }
    if (busyReturn) {
        return MessageProcessingResult::BUSY;
    }
    sleeplock();
    MessageProcessingResult ret;
    switch (getState()) {
        case FederateStates::ERRORED:
            ret = MessageProcessingResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = MessageProcessingResult::HALTED;
            break;
        default:  // everything >= INITIALIZING
            ret = MessageProcessingResult::NEXT_STEP;
            break;
    }
    unlock();
    return ret;
}